

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_module_final(lyd_node *tree,lys_module *module,uint32_t val_opts)

{
  lysc_node *plVar1;
  ly_ctx *plVar2;
  LY_ERR LVar3;
  lys_module *plVar4;
  char *pcVar5;
  ly_ht *getnext_ht;
  uint32_t i;
  lyd_node *first;
  
  i = 0;
  getnext_ht = (ly_ht *)0x0;
  if (module == (lys_module *)0x0) {
    pcVar5 = "module";
  }
  else {
    if ((val_opts & 0x22) == 0) {
      if (tree != (lyd_node *)0x0) {
        plVar1 = tree->schema;
        if (plVar1 == (lysc_node *)0x0) {
          plVar2 = (ly_ctx *)tree[2].schema;
        }
        else {
          plVar2 = plVar1->module->ctx;
        }
        if ((plVar2 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
          if (plVar1 == (lysc_node *)0x0) {
            plVar4 = (lys_module *)&tree[2].schema;
          }
          else {
            plVar4 = plVar1->module;
          }
          if (plVar4->ctx != module->ctx) {
            if (plVar1 == (lysc_node *)0x0) {
              plVar4 = (lys_module *)&tree[2].schema;
            }
            else {
              plVar4 = plVar1->module;
            }
            ly_log(plVar4->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
      plVar4 = lyd_mod_next_module(tree,module,module->ctx,&i,&first);
      if (plVar4 != (lys_module *)0x0) {
        LVar3 = lyd_val_getnext_ht_new(&getnext_ht);
        if (LVar3 == LY_SUCCESS) {
          LVar3 = lyd_validate_final_r
                            (first,(lyd_node *)0x0,(lysc_node *)0x0,plVar4,(lysc_ext_instance *)0x0,
                             val_opts,0,0,getnext_ht);
        }
        lyht_free(getnext_ht,lyd_val_getnext_ht_free_cb);
        return LVar3;
      }
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                    ,0x876,
                    "LY_ERR lyd_validate_module_final(struct lyd_node *, const struct lys_module *, uint32_t)"
                   );
    }
    pcVar5 = "!(val_opts & (0x0002 | 0x0020))";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,
         "lyd_validate_module_final");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_module_final(struct lyd_node *tree, const struct lys_module *module, uint32_t val_opts)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *first;
    const struct lys_module *mod;
    uint32_t i = 0;
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, module, !(val_opts & (LYD_VALIDATE_PRESENT | LYD_VALIDATE_NOT_FINAL)), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(tree ? LYD_CTX(tree) : NULL, module->ctx, LY_EINVAL);

    /* module is unchanged but we need to get the first module data node */
    mod = lyd_mod_next_module(tree, module, module->ctx, &i, &first);
    assert(mod);

    /* create the getnext hash table for this module */
    r = lyd_val_getnext_ht_new(&getnext_ht);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    /* perform final validation that assumes the data tree is final */
    r = lyd_validate_final_r(first, NULL, NULL, mod, NULL, val_opts, 0, 0, getnext_ht);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

cleanup:
    lyd_val_getnext_ht_free(getnext_ht);
    return rc;
}